

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Lcorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  Cec_ParCor_t Pars;
  
  Cec_ManCorSetDefaultParams(&Pars);
  Pars.fLatchCorr = 1;
  Extra_UtilGetoptReset();
  pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_0020f05f:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FCPrcvwh");
    iVar2 = globalUtilOptind;
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0020f1a7:
        Abc_Print(-1,pcVar5);
        goto LAB_0020f1b4;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
    }
    else if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0020f1a7;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFrames = iVar1;
    }
    else {
      if (iVar1 != 0x50) {
        if (iVar1 == 99) {
          Pars.fUseCSat = Pars.fUseCSat ^ 1;
        }
        else if (iVar1 == 0x72) {
          Pars.fUseRings = Pars.fUseRings ^ 1;
        }
        else if (iVar1 == 0x76) {
          Pars.fVerbose = Pars.fVerbose ^ 1;
        }
        else {
          if (iVar1 != 0x77) {
            if (iVar1 == -1) {
              if (pAbc->pGia != (Gia_Man_t *)0x0) {
                iVar2 = Gia_ManBoxNum(pAbc->pGia);
                if ((iVar2 == 0) || (iVar2 = Gia_ManRegBoxNum(pAbc->pGia), iVar2 == 0)) {
                  if (pAbc->pGia->nRegs == 0) {
                    Abc_Print(-1,"The network is combinational.\n");
                    return 0;
                  }
                  pGVar3 = Cec_ManLSCorrespondence(pAbc->pGia,&Pars);
                  Abc_FrameUpdateGia(pAbc,pGVar3);
                }
                else {
                  if (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0) {
                    pGVar3 = Gia_ManSweepWithBoxes
                                       (pAbc->pGia,(void *)0x0,&Pars,0,0,Pars.fVerbose,
                                        Pars.fVerboseFlops);
                    Abc_FrameUpdateGia(pAbc,pGVar3);
                    return 0;
                  }
                  puts("Timing manager is given but there is no GIA of boxes.");
                }
                return 0;
              }
              pcVar5 = "Abc_CommandAbc9Lcorr(): There is no AIG.\n";
              iVar2 = -1;
              goto LAB_0020f29a;
            }
            goto LAB_0020f1b4;
          }
          Pars.fVerboseFlops = Pars.fVerboseFlops ^ 1;
        }
        goto LAB_0020f05f;
      }
      if (argc <= globalUtilOptind) goto LAB_0020f1a7;
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nPrefix = iVar1;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
LAB_0020f1b4:
      iVar2 = -2;
      Abc_Print(-2,"usage: &lcorr [-FCP num] [-rcvwh]\n");
      Abc_Print(-2,"\t         performs latch correpondence computation\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,"\t-F num : the number of timeframes in inductive case [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-P num : the number of timeframes in the prefix [default = %d]\n",
                (ulong)(uint)Pars.nPrefix);
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (Pars.fUseRings == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle using implication rings during refinement [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (Pars.fUseCSat == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      if (Pars.fVerboseFlops == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n"
                ,pcVar4);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_0020f29a:
      Abc_Print(iVar2,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Lcorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCor_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManCorSetDefaultParams( pPars );
    pPars->fLatchCorr = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCPrcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPrefix = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPrefix < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fUseRings ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVerboseFlops ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lcorr(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && Gia_ManRegBoxNum(pAbc->pGia) )
    {
        if ( pAbc->pGia->pAigExtra == NULL )
        {
            printf( "Timing manager is given but there is no GIA of boxes.\n" );
            return 0;
        }
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, NULL, pPars, 0, 0, pPars->fVerbose, pPars->fVerboseFlops );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Cec_ManLSCorrespondence( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &lcorr [-FCP num] [-rcvwh]\n" );
    Abc_Print( -2, "\t         performs latch correpondence computation\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-F num : the number of timeframes in inductive case [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-P num : the number of timeframes in the prefix [default = %d]\n", pPars->nPrefix );
    Abc_Print( -2, "\t-r     : toggle using implication rings during refinement [default = %s]\n", pPars->fUseRings? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n", pPars->fVerboseFlops? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}